

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall libtorrent::session::session(session *this,session_params *params)

{
  session_params local_1e8;
  session_flags_t local_19;
  session_params *local_18;
  session_params *params_local;
  session *this_local;
  
  local_18 = params;
  params_local = (session_params *)this;
  session_handle::session_handle(&this->super_session_handle);
  ::std::shared_ptr<boost::asio::io_context>::shared_ptr(&this->m_io_service);
  ::std::shared_ptr<std::thread>::shared_ptr(&this->m_thread);
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr(&this->m_impl);
  local_19.m_val = (local_18->flags).m_val;
  session_params::session_params(&local_1e8,local_18);
  start(this,local_19,&local_1e8,(io_context *)0x0);
  session_params::~session_params(&local_1e8);
  return;
}

Assistant:

session::session(session_params const& params)
	{
		start(params.flags, session_params(params), nullptr);
	}